

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ReduceLogSumLayerParams::ReduceLogSumLayerParams
          (ReduceLogSumLayerParams *this,ReduceLogSumLayerParams *from)

{
  InternalMetadataWithArenaLite *this_00;
  ReduceLogSumLayerParams *from_local;
  ReduceLogSumLayerParams *this_local;
  string *local_20;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__ReduceLogSumLayerParams_00571978
  ;
  google::protobuf::internal::InternalMetadataWithArenaLite::InternalMetadataWithArenaLite
            (&this->_internal_metadata_,(Arena *)0x0);
  google::protobuf::RepeatedField<long>::RepeatedField(&this->axes_,&from->axes_);
  this->_cached_size_ = 0;
  this_00 = &from->_internal_metadata_;
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
             ).ptr_ & 1) == 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
               ).ptr_ & 1) == 1) {
      local_20 = (string *)
                 google::protobuf::internal::
                 InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                           ((InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                             *)this_00);
    }
    else {
      local_20 = google::protobuf::internal::InternalMetadataWithArenaLite::
                 default_instance_abi_cxx11_();
    }
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,local_20);
  }
  memcpy(&this->keepdims_,&from->keepdims_,2);
  return;
}

Assistant:

ReduceLogSumLayerParams::ReduceLogSumLayerParams(const ReduceLogSumLayerParams& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      axes_(from.axes_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::memcpy(&keepdims_, &from.keepdims_,
    reinterpret_cast<char*>(&reduceall_) -
    reinterpret_cast<char*>(&keepdims_) + sizeof(reduceall_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.ReduceLogSumLayerParams)
}